

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::~Fl_Preferences(Fl_Preferences *this)

{
  Fl_Preferences *this_local;
  
  ~Fl_Preferences(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

Fl_Preferences::~Fl_Preferences() {
  if (node && !node->parent()) delete rootNode;
  // DO NOT delete nodes! The root node will do that after writing the preferences
  // zero all pointer to avoid memory errors, even though
  // Valgrind does not complain (Cygwin does though)
  node = 0L;
  rootNode = 0L;
}